

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cc
# Opt level: O3

statemachine_ctx * ctemplate_htmlparser::statemachine_new(statemachine_definition *def,void *user)

{
  statemachine_ctx *psVar1;
  
  if (def != (statemachine_definition *)0x0) {
    psVar1 = (statemachine_ctx *)malloc(0x188);
    if (psVar1 != (statemachine_ctx *)0x0) {
      psVar1->current_state = 0;
      psVar1->next_state = 0;
      psVar1->record_buffer[0] = '\0';
      psVar1->record_pos = 0;
      psVar1->recording = 0;
      psVar1->line_number = 1;
      psVar1->column_number = 1;
      psVar1->definition = def;
      psVar1->user = user;
    }
    return psVar1;
  }
  __assert_fail("def != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                ,0xf3,
                "statemachine_ctx *ctemplate_htmlparser::statemachine_new(statemachine_definition *, void *)"
               );
}

Assistant:

statemachine_ctx *statemachine_new(statemachine_definition *def,
                                   void *user)
{
    statemachine_ctx *ctx;
    assert(def != NULL);
    ctx = CAST(statemachine_ctx *, malloc(sizeof(statemachine_ctx)));
    if (ctx == NULL)
      return NULL;

    statemachine_reset(ctx);

    ctx->definition = def;
    ctx->user = user;

    return ctx;
}